

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.h
# Opt level: O0

type dlib::assign_pixel_helpers::assign<dlib::rgb_pixel,dlib::hsi_pixel>
               (rgb_pixel *dest,hsi_pixel *src)

{
  HSL c1;
  long in_RSI;
  undefined1 *in_RDI;
  HSL h;
  COLOUR c;
  double local_58;
  double dStackY_50;
  double local_48;
  undefined8 in_stack_ffffffffffffffd8;
  double in_stack_ffffffffffffffe0;
  
  c1.s = (double)in_stack_ffffffffffffffd8;
  c1.h = (double)*(byte *)(in_RSI + 2) / 255.0;
  c1.l = in_stack_ffffffffffffffe0;
  HSL2RGB(c1);
  *in_RDI = (char)(int)(local_58 * 255.0 + 0.5);
  in_RDI[1] = (char)(int)(dStackY_50 * 255.0 + 0.5);
  in_RDI[2] = (char)(int)(local_48 * 255.0 + 0.5);
  return;
}

Assistant:

typename enable_if_c<pixel_traits<P1>::rgb && pixel_traits<P2>::hsi>::type
        assign(P1& dest, const P2& src) 
        { 
            COLOUR c;
            HSL h;
            h.h = src.h;
            h.h = h.h/255.0*360;
            h.s = src.s/255.0;
            h.l = src.i/255.0;
            c = HSL2RGB(h);

            dest.red = static_cast<unsigned char>(c.r*255.0 + 0.5);
            dest.green = static_cast<unsigned char>(c.g*255.0 + 0.5);
            dest.blue = static_cast<unsigned char>(c.b*255.0 + 0.5);
        }